

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.h
# Opt level: O0

bool __thiscall
Potassco::ProgramOptions::
OptionOutputImpl<Potassco::ProgramOptions::OstreamWriter,_Potassco::ProgramOptions::DefaultFormat>::
printOption(OptionOutputImpl<Potassco::ProgramOptions::OstreamWriter,_Potassco::ProgramOptions::DefaultFormat>
            *this,Option *opt,size_t maxW)

{
  void *pvVar1;
  Value *__n;
  size_t in_RDX;
  Option *in_RSI;
  long in_RDI;
  size_t in_stack_00000008;
  Option *in_stack_00000010;
  vector<char,_std::allocator<char>_> *in_stack_00000018;
  DefaultFormat *in_stack_00000020;
  Value *in_stack_00000028;
  char *in_stack_00000030;
  vector<char,_std::allocator<char>_> *in_stack_00000038;
  
  pvVar1 = (void *)DefaultFormat::format
                             (in_stack_00000020,in_stack_00000018,in_stack_00000010,
                              in_stack_00000008);
  OstreamWriter::write((OstreamWriter *)(in_RDI + 0x20),(int)in_RDI + 8,pvVar1,in_RDX);
  Option::description(in_RSI);
  __n = Option::value(in_RSI);
  pvVar1 = (void *)DefaultFormat::format
                             ((DefaultFormat *)maxW,in_stack_00000038,in_stack_00000030,
                              in_stack_00000028,(size_t)in_stack_00000020);
  OstreamWriter::write((OstreamWriter *)(in_RDI + 0x20),(int)in_RDI + 8,pvVar1,(size_t)__n);
  return true;
}

Assistant:

bool printOption(const Option& opt, std::size_t maxW) {
		writer_.write(buffer_, formatter_.format(buffer_, opt, maxW));
		writer_.write(buffer_, formatter_.format(buffer_, opt.description(), *opt.value(), maxW));
		return true;
	}